

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstracttxin.cpp
# Opt level: O1

void __thiscall
AbstractTxIn_ConstractorGetterSetter_Test::~AbstractTxIn_ConstractorGetterSetter_Test
          (AbstractTxIn_ConstractorGetterSetter_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AbstractTxIn, ConstractorGetterSetter) {
  const auto check = [](AbstractTxIn actual) -> void {
    EXPECT_STREQ(expect_txid.GetHex().c_str(),
        actual.GetTxid().GetHex().c_str());
    EXPECT_EQ(expect_index, actual.GetVout());
    EXPECT_STREQ(expect_txid.GetHex().c_str(),
        actual.GetOutPoint().GetTxid().GetHex().c_str());
    EXPECT_EQ(expect_index, actual.GetOutPoint().GetVout());
    EXPECT_EQ(expect_sequence, actual.GetSequence());
    EXPECT_STREQ(expect_script_hex.c_str(),
        actual.GetUnlockingScript().GetScript().GetHex().c_str());
  };

  {
    AbstractTxIn actual = AbstractTxIn(expect_txid, expect_index,
                                       expect_sequence,
                                       expect_unlocking_script);
    check(actual);
  }

  {
    AbstractTxIn actual = AbstractTxIn(expect_txid, expect_index,
                                       expect_sequence);
    actual.SetUnlockingScript(expect_unlocking_script);
    check(actual);
  }
}